

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::
AppendSize<google::protobuf::internal::EpsCopyInputStream::AppendStringFallback(char_const*,int,std::__cxx11::string*)::__0>
          (EpsCopyInputStream *this,char *ptr,int size,anon_class_8_1_ba1d7991 *append)

{
  LogMessage *other;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  int local_34;
  anon_class_8_1_ba1d7991 *paStack_30;
  int chunk_size;
  anon_class_8_1_ba1d7991 *append_local;
  char *pcStack_20;
  int size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  local_34 = ((int)this->buffer_end_ + 0x10) - (int)ptr;
  paStack_30 = append;
  append_local._4_4_ = size;
  pcStack_20 = ptr;
  ptr_local = (char *)this;
  while( true ) {
    local_71 = 0;
    if (append_local._4_4_ <= local_34) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                 ,0x146);
      local_71 = 1;
      other = LogMessage::operator<<(&local_70,"CHECK failed: size > chunk_size: ");
      LogFinisher::operator=(local_85,other);
    }
    if ((local_71 & 1) != 0) {
      LogMessage::~LogMessage(&local_70);
    }
    if (this->next_chunk_ == (char *)0x0) {
      return (char *)0x0;
    }
    AppendStringFallback::anon_class_8_1_ba1d7991::operator()(paStack_30,pcStack_20,local_34);
    pcStack_20 = pcStack_20 + local_34;
    append_local._4_4_ = append_local._4_4_ - local_34;
    if (this->limit_ < 0x11) {
      return (char *)0x0;
    }
    pcStack_20 = Next(this);
    if (pcStack_20 == (char *)0x0) break;
    pcStack_20 = pcStack_20 + 0x10;
    local_34 = ((int)this->buffer_end_ + 0x10) - (int)pcStack_20;
    if (append_local._4_4_ <= local_34) {
      AppendStringFallback::anon_class_8_1_ba1d7991::operator()
                (paStack_30,pcStack_20,append_local._4_4_);
      return pcStack_20 + append_local._4_4_;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* AppendSize(const char* ptr, int size, const A& append) {
    int chunk_size = buffer_end_ + kSlopBytes - ptr;
    do {
      GOOGLE_DCHECK(size > chunk_size);
      if (next_chunk_ == nullptr) return nullptr;
      append(ptr, chunk_size);
      ptr += chunk_size;
      size -= chunk_size;
      // TODO(gerbens) Next calls NextBuffer which generates buffers with
      // overlap and thus incurs cost of copying the slop regions. This is not
      // necessary for reading strings. We should just call Next buffers.
      if (limit_ <= kSlopBytes) return nullptr;
      ptr = Next();
      if (ptr == nullptr) return nullptr;  // passed the limit
      ptr += kSlopBytes;
      chunk_size = buffer_end_ + kSlopBytes - ptr;
    } while (size > chunk_size);
    append(ptr, size);
    return ptr + size;
  }